

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa.cpp
# Opt level: O2

unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> __thiscall
mg::data::MappedHfa::parse(MappedHfa *this,shared_ptr<mg::fs::MappedFile> *backing_data)

{
  element_type *peVar1;
  undefined8 uVar2;
  _Head_base<0UL,_mg::data::MappedHfa_*,_false> _Var3;
  int iVar4;
  MappedHfa *this_00;
  char *__ptr;
  uint8_t *puVar5;
  bool bVar6;
  size_t sStack_120;
  undefined1 local_118 [8];
  PackedEntryHeader entry;
  FileHeader header;
  _Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
  local_80;
  undefined1 auStack_68 [8];
  vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
  entries;
  __shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> local_48;
  _Head_base<0UL,_mg::data::MappedHfa_*,_false> local_38;
  
  peVar1 = (backing_data->super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if ((ulong)peVar1->_size < 0x10) {
    __ptr = "File too short to read header\n";
    sStack_120 = 0x1e;
  }
  else {
    puVar5 = peVar1->_data;
    entry._padding._16_8_ = *(undefined8 *)puVar5;
    uVar2 = *(undefined8 *)(puVar5 + 8);
    iVar4 = bcmp(entry._padding + 0x10,"HUNEXGGEFA10",0xc);
    if (iVar4 == 0) {
      entries.
      super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_68 = (undefined1  [8])0x0;
      entries.
      super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      header.magic._4_4_ = SUB84((ulong)uVar2 >> 0x20,0);
      puVar5 = puVar5 + 0x10;
      local_38._M_head_impl = this;
      while (bVar6 = header.magic._4_4_ != 0, header.magic._4_4_ = header.magic._4_4_ + -1, bVar6) {
        memcpy((PackedEntryHeader *)local_118,puVar5,0x80);
        std::
        vector<mg::data::Hfa::PackedEntryHeader,std::allocator<mg::data::Hfa::PackedEntryHeader>>::
        emplace_back<mg::data::Hfa::PackedEntryHeader&>
                  ((vector<mg::data::Hfa::PackedEntryHeader,std::allocator<mg::data::Hfa::PackedEntryHeader>>
                    *)auStack_68,(PackedEntryHeader *)local_118);
        puVar5 = puVar5 + 0x80;
      }
      this_00 = (MappedHfa *)operator_new(0x28);
      std::__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,
                 &backing_data->super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>);
      std::
      vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>::
      vector((vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
              *)&local_80,
             (vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
              *)auStack_68);
      _Var3._M_head_impl = local_38._M_head_impl;
      MappedHfa(this_00,(shared_ptr<mg::fs::MappedFile> *)&local_48,
                (vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                 *)&local_80);
      ((_Var3._M_head_impl)->_backing_data).
      super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this_00;
      std::
      _Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
      ::~_Vector_base(&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      std::
      _Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
      ::~_Vector_base((_Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                       *)auStack_68);
      return (__uniq_ptr_data<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>,_true,_true>
              )(__uniq_ptr_data<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>,_true,_true>
                )_Var3._M_head_impl;
    }
    __ptr = "File has invalid magic\n";
    sStack_120 = 0x17;
  }
  fwrite(__ptr,sStack_120,1,_stderr);
  (this->_backing_data).super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return (__uniq_ptr_data<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>,_true,_true>
         )(__uniq_ptr_data<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<MappedHfa>
MappedHfa::parse(std::shared_ptr<mg::fs::MappedFile> backing_data) {
  // Check file larger enough to have a header
  if ((size_t)backing_data->size() < sizeof(Hfa::FileHeader)) {
    fprintf(stderr, "File too short to read header\n");
    return nullptr;
  }

  // Check magic is correct
  Hfa::FileHeader header = *(Hfa::FileHeader *)backing_data->data();
  if (!!memcmp(header.magic, Hfa::MAGIC, strlen(Hfa::MAGIC))) {
    fprintf(stderr, "File has invalid magic\n");
    return nullptr;
  }

  // Parse each of the header entries
  std::vector<Hfa::PackedEntryHeader> entries;
  const uint32_t entry_count = le_to_host_u32(header.entry_count);
  const Hfa::PackedEntryHeader *entry_ptr =
      reinterpret_cast<const Hfa::PackedEntryHeader *>(backing_data->data() +
                                                       sizeof(Hfa::FileHeader));
  for (uint32_t i = 0; i < entry_count; i++, entry_ptr++) {
    // Copy the entry, convert it to host order and add it to our entry list
    Hfa::PackedEntryHeader entry = *entry_ptr;
    entry.to_host_order();
    entries.emplace_back(entry);
  }

  return std::unique_ptr<MappedHfa>(new MappedHfa(backing_data, entries));
}